

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbifnet.cpp
# Opt level: O0

void __thiscall TadsHttpReqResult::~TadsHttpReqResult(TadsHttpReqResult *this)

{
  long lVar1;
  CVmObjTable *in_RDI;
  vm_globalvar_t *in_stack_ffffffffffffffe8;
  
  in_RDI->post_load_init_table_ = (CVmHashTable *)&PTR__TadsHttpReqResult_0042b8e0;
  CVmObjTable::delete_global_var(in_RDI,in_stack_ffffffffffffffe8);
  lVar1._0_4_ = in_RDI->gc_queue_head_;
  lVar1._4_4_ = in_RDI->finalize_queue_head_;
  if ((lVar1 != 0) && (*(long **)&in_RDI->gc_queue_head_ != (long *)0x0)) {
    (**(code **)(**(long **)&in_RDI->gc_queue_head_ + 8))();
  }
  if ((*(long *)&in_RDI->allocs_since_gc_ != 0) &&
     (*(void **)&in_RDI->allocs_since_gc_ != (void *)0x0)) {
    operator_delete__(*(void **)&in_RDI->allocs_since_gc_);
  }
  if (in_RDI->bytes_since_gc_ != 0) {
    lib_free_str((char *)0x253ad2);
  }
  TadsEventMessage::~TadsEventMessage((TadsEventMessage *)0x253ae0);
  return;
}

Assistant:

~TadsHttpReqResult()
    {
        /* establish the global context */
        VMGLOB_PTR(vmg);

        /* delete our ID global */
        G_obj_table->delete_global_var(idg);

        /* delete the reply object */
        if (reply != 0)
            delete reply;

        /* free the reply headers */
        if (hdrs != 0)
            delete [] hdrs;

        /* free the redirect location string, if we have one */
        if (loc != 0)
            lib_free_str(loc);
    }